

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-diy-fp.cc
# Opt level: O0

void TestSubtract(void)

{
  char *file;
  DiyFp DVar1;
  DiyFp diff;
  DiyFp diy_fp2;
  DiyFp diy_fp1;
  undefined4 in_stack_ffffffffffffffa8;
  int exponent;
  DiyFp *this;
  DiyFp *this_00;
  int line;
  int in_stack_ffffffffffffffcc;
  char *file_00;
  DiyFp local_20;
  DiyFp local_10;
  
  this = &local_10;
  exponent = 0;
  double_conversion::DiyFp::DiyFp(this,3,0);
  this_00 = &local_20;
  double_conversion::DiyFp::DiyFp(this_00,1,exponent);
  line = (int)((ulong)this_00 >> 0x20);
  DVar1 = double_conversion::DiyFp::Minus
                    ((DiyFp *)CONCAT44(exponent,in_stack_ffffffffffffffa8),(DiyFp *)0x85dd95);
  file = (char *)DVar1.f_;
  file_00 = file;
  double_conversion::DiyFp::f((DiyFp *)&stack0xffffffffffffffd0);
  CheckHelper(file,line,(char *)this,SUB41((uint)exponent >> 0x18,0));
  double_conversion::DiyFp::e((DiyFp *)&stack0xffffffffffffffd0);
  CheckEqualsHelper(file_00,in_stack_ffffffffffffffcc,file,line,(char *)this,exponent);
  double_conversion::DiyFp::Subtract(&local_10,&local_20);
  double_conversion::DiyFp::f(&local_10);
  CheckHelper(file,line,(char *)this,SUB41((uint)exponent >> 0x18,0));
  double_conversion::DiyFp::e(&local_10);
  CheckEqualsHelper(file_00,in_stack_ffffffffffffffcc,file,line,(char *)this,exponent);
  return;
}

Assistant:

TEST(Subtract) {
  DiyFp diy_fp1 = DiyFp(3, 0);
  DiyFp diy_fp2 = DiyFp(1, 0);
  DiyFp diff = DiyFp::Minus(diy_fp1, diy_fp2);

  CHECK(2 == diff.f());  // NOLINT
  CHECK_EQ(0, diff.e());
  diy_fp1.Subtract(diy_fp2);
  CHECK(2 == diy_fp1.f());  // NOLINT
  CHECK_EQ(0, diy_fp1.e());
}